

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall HighsDomain::markPropagate(HighsDomain *this,HighsInt row)

{
  bool bVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  int in_ESI;
  long in_RDI;
  double dVar7;
  double dVar8;
  bool propupper;
  bool proplower;
  double in_stack_ffffffffffffff88;
  HighsInt col;
  HighsMipSolver *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  bool local_49;
  
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x108),
                      (long)in_ESI);
  if (*pvVar3 != '\0') {
    return;
  }
  dVar7 = HighsMipSolver::rowLower
                    (in_stack_ffffffffffffff90,(HighsInt)((ulong)in_stack_ffffffffffffff88 >> 0x20))
  ;
  bVar1 = false;
  if ((dVar7 != -INFINITY) || (NAN(dVar7))) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0),(long)in_ESI);
    if (*pvVar4 == 0) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0x90),(long)in_ESI
                );
      HighsMipSolver::rowLower
                (in_stack_ffffffffffffff90,(HighsInt)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x5c4b2d);
      bVar2 = HighsCDouble::operator<
                        ((HighsCDouble *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      bVar1 = false;
      if (!bVar2) goto LAB_005c4bfa;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd8),(long)in_ESI);
    bVar1 = true;
    if (*pvVar4 != 1) {
      pvVar5 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                         ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0xa8),
                          (long)in_ESI);
      dVar7 = HighsCDouble::operator_cast_to_double(pvVar5);
      dVar8 = HighsMipSolver::rowLower
                        (in_stack_ffffffffffffff90,
                         (HighsInt)((ulong)in_stack_ffffffffffffff88 >> 0x20));
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf0),(long)in_ESI);
      bVar1 = dVar7 - dVar8 <= *pvVar6;
    }
  }
LAB_005c4bfa:
  dVar7 = HighsMipSolver::rowUpper
                    (in_stack_ffffffffffffff90,(HighsInt)((ulong)in_stack_ffffffffffffff88 >> 0x20))
  ;
  local_49 = false;
  if ((dVar7 != INFINITY) || (NAN(dVar7))) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd8),(long)in_ESI);
    if (*pvVar4 == 0) {
      std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0xa8),(long)in_ESI
                );
      in_stack_ffffffffffffffa0 =
           (vector<int,_std::allocator<int>_> *)
           HighsMipSolver::rowUpper
                     (in_stack_ffffffffffffff90,(HighsInt)((ulong)in_stack_ffffffffffffff88 >> 0x20)
                     );
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x5c4ca1);
      bVar2 = HighsCDouble::operator>
                        ((HighsCDouble *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_49 = false;
      if (!bVar2) goto LAB_005c4d6c;
    }
    col = (HighsInt)((ulong)in_stack_ffffffffffffff88 >> 0x20);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0),(long)in_ESI);
    in_stack_ffffffffffffff9f = true;
    local_49 = (bool)in_stack_ffffffffffffff9f;
    if (*pvVar4 != 1) {
      dVar8 = HighsMipSolver::rowUpper(in_stack_ffffffffffffff90,col);
      pvVar5 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                         ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0x90),
                          (long)in_ESI);
      dVar7 = HighsCDouble::operator_cast_to_double(pvVar5);
      dVar8 = dVar8 - dVar7;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf0),(long)in_ESI);
      in_stack_ffffffffffffff9f = dVar8 <= *pvVar6;
      local_49 = (bool)in_stack_ffffffffffffff9f;
    }
  }
LAB_005c4d6c:
  if ((bVar1) || (local_49 != false)) {
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffa0,
               (value_type_conflict2 *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)
              );
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x108),
                        (long)in_ESI);
    *pvVar3 = '\x01';
  }
  return;
}

Assistant:

void HighsDomain::markPropagate(HighsInt row) {
  if (!propagateflags_[row]) {
    bool proplower = mipsolver->rowLower(row) != -kHighsInf &&
                     (activitymininf_[row] != 0 ||
                      activitymin_[row] < mipsolver->rowLower(row) -
                                              mipsolver->mipdata_->feastol) &&
                     (activitymaxinf_[row] == 1 ||
                      (double(activitymax_[row]) - mipsolver->rowLower(row)) <=
                          capacityThreshold_[row]);
    bool propupper = mipsolver->rowUpper(row) != kHighsInf &&
                     (activitymaxinf_[row] != 0 ||
                      activitymax_[row] > mipsolver->rowUpper(row) +
                                              mipsolver->mipdata_->feastol) &&
                     (activitymininf_[row] == 1 ||
                      (mipsolver->rowUpper(row) - double(activitymin_[row])) <=
                          capacityThreshold_[row]);

    if (proplower || propupper) {
      propagateinds_.push_back(row);
      propagateflags_[row] = 1;
    }
  }
}